

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O0

int lj_cf_os_setlocale(lua_State *L)

{
  int __category;
  GCstr *pGVar1;
  lua_State *in_RDI;
  int opt;
  char *str;
  GCstr *s;
  undefined8 in_stack_ffffffffffffffd8;
  lua_State *L_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  pGVar1 = lj_lib_optstr((lua_State *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                         (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  if (pGVar1 == (GCstr *)0x0) {
    L_00 = (lua_State *)0x0;
  }
  else {
    L_00 = (lua_State *)(pGVar1 + 1);
  }
  __category = lj_lib_checkopt(in_RDI,(int)((ulong)pGVar1 >> 0x20),(int)pGVar1,(char *)L_00);
  if (__category == 0) {
    __category = 0;
  }
  else if (__category == 1) {
    __category = 1;
  }
  else if (__category == 2) {
    __category = 2;
  }
  else if (__category == 3) {
    __category = 3;
  }
  else if (__category == 4) {
    __category = 4;
  }
  else if (__category == 6) {
    __category = 6;
  }
  setlocale(__category,(char *)L_00);
  lua_pushstring(L_00,(char *)CONCAT44(__category,in_stack_ffffffffffffffe0));
  return 1;
}

Assistant:

LJLIB_CF(os_setlocale)
{
#if LJ_TARGET_PSVITA
  lua_pushliteral(L, "C");
#else
  GCstr *s = lj_lib_optstr(L, 1);
  const char *str = s ? strdata(s) : NULL;
  int opt = lj_lib_checkopt(L, 2, 6,
    "\5ctype\7numeric\4time\7collate\10monetary\1\377\3all");
  if (opt == 0) opt = LC_CTYPE;
  else if (opt == 1) opt = LC_NUMERIC;
  else if (opt == 2) opt = LC_TIME;
  else if (opt == 3) opt = LC_COLLATE;
  else if (opt == 4) opt = LC_MONETARY;
  else if (opt == 6) opt = LC_ALL;
  lua_pushstring(L, setlocale(opt, str));
#endif
  return 1;
}